

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_mark_n(REF_SUBDIV ref_subdiv,REF_INT *n)

{
  uint uVar1;
  undefined8 in_RAX;
  REF_EDGE ref_edge;
  long lVar2;
  REF_INT part;
  undefined8 uStack_38;
  
  *n = 0;
  ref_edge = ref_subdiv->edge;
  if (0 < ref_edge->n) {
    lVar2 = 0;
    uStack_38 = in_RAX;
    do {
      if (ref_subdiv->mark[lVar2] != 0) {
        uVar1 = ref_edge_part(ref_edge,(REF_INT)lVar2,(REF_INT *)((long)&uStack_38 + 4));
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xc4,"ref_subdiv_mark_n",(ulong)uVar1,"edge part");
          return uVar1;
        }
        if (uStack_38._4_4_ == ref_subdiv->grid->mpi->id) {
          *n = *n + 1;
        }
      }
      lVar2 = lVar2 + 1;
      ref_edge = ref_subdiv->edge;
    } while (lVar2 < ref_edge->n);
  }
  uVar1 = ref_mpi_allsum(ref_subdiv->grid->mpi,n,1,1);
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",199,
           "ref_subdiv_mark_n",(ulong)uVar1,"allsum");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_n(REF_SUBDIV ref_subdiv, REF_INT *n) {
  REF_INT edge, part;

  *n = 0;
  for (edge = 0; edge < ref_edge_n(ref_subdiv_edge(ref_subdiv)); edge++)
    if (0 != ref_subdiv_mark(ref_subdiv, edge)) {
      RSS(ref_edge_part(ref_subdiv_edge(ref_subdiv), edge, &part), "edge part")
      if (part == ref_mpi_rank(ref_subdiv_mpi(ref_subdiv))) (*n)++;
    }
  RSS(ref_mpi_allsum(ref_subdiv_mpi(ref_subdiv), n, 1, REF_INT_TYPE), "allsum");

  return REF_SUCCESS;
}